

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O1

VariableIndex __thiscall
dynet::ComputationGraph::add_function<dynet::VanillaLSTMGates,float&>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments,float *side_information)

{
  pointer *pppNVar1;
  iterator __position;
  Node *pNVar2;
  Device **ppDVar3;
  VariableIndex new_node_index;
  allocator_type local_31;
  float local_30;
  VariableIndex local_2c;
  Node *local_28;
  
  local_2c = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pNVar2 = (Node *)operator_new(0x68);
  local_30 = *side_information;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_005bafc8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&pNVar2->args,*arguments,&local_31);
  (pNVar2->dim).nd = 0;
  (pNVar2->dim).bd = 1;
  pNVar2->device = (Device *)0x0;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_005bded0;
  *(float *)&pNVar2[1]._vptr_Node = local_30;
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = pNVar2;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,&local_28);
  }
  else {
    *__position._M_current = pNVar2;
    pppNVar1 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  pNVar2 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  if (pNVar2->device == (Device *)0x0) {
    if (arguments->_M_len == 0) {
      ppDVar3 = (Device **)&dynet::default_device;
    }
    else {
      ppDVar3 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[*arguments->_M_array]->device;
    }
    pNVar2->device = *ppDVar3;
  }
  set_dim_for_new_node(this,&local_2c);
  return local_2c;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
    Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}